

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

void reviseTimeZone(QDateTimeData *d,QTimeZone *zone,TransitionResolution resolve)

{
  bool bVar1;
  TimeSpec spec_00;
  QFlagsStorage<QDateTimePrivate::StatusFlag> mask;
  Int IVar2;
  QFlags<QDateTimePrivate::StatusFlag> QVar3;
  TransitionOptions TVar4;
  QTimeZone *zone_00;
  QDateTimePrivate *pQVar5;
  QFlagsStorage<QDateTimePrivate::TransitionOption> in_EDX;
  TransitionResolution in_ESI;
  Data *in_RDI;
  long in_FS_OFFSET;
  int offset;
  bool reuse;
  TimeSpec spec;
  StatusFlags status;
  QDateTimeData *in_stack_ffffffffffffffa0;
  QFlagsStorage<QDateTimePrivate::StatusFlag> in_stack_ffffffffffffffa8;
  QFlagsStorage<QDateTimePrivate::StatusFlag> in_stack_ffffffffffffffbc;
  int iVar6;
  bool local_35;
  QFlagsStorage<QDateTimePrivate::StatusFlag> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  spec_00 = QTimeZone::timeSpec((QTimeZone *)0x16fc8a);
  local_c.i = 0xaaaaaaaa;
  getStatus(in_stack_ffffffffffffffa0);
  local_c.i = (Int)mergeSpec(in_stack_ffffffffffffffa8.i,
                             (TimeSpec)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  local_35 = QDateTime::Data::isShort(in_RDI);
  iVar6 = 0;
  zone_00 = (QTimeZone *)(ulong)spec_00;
  switch(zone_00) {
  case (QTimeZone *)0x0:
    break;
  case (QTimeZone *)0x1:
    break;
  case (QTimeZone *)0x2:
    local_35 = false;
    iVar6 = QTimeZone::fixedSecondsAheadOfUtc((QTimeZone *)&in_stack_ffffffffffffffa0->data);
    break;
  case (QTimeZone *)0x3:
    local_35 = false;
  }
  operator|((enum_type)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
            (enum_type)in_stack_ffffffffffffffa0);
  mask.i = (Int)QFlags<QDateTimePrivate::StatusFlag>::operator~
                          ((QFlags<QDateTimePrivate::StatusFlag> *)&in_stack_ffffffffffffffa0->data)
  ;
  QFlags<QDateTimePrivate::StatusFlag>::operator&=
            ((QFlags<QDateTimePrivate::StatusFlag> *)&local_c,
             (QFlags<QDateTimePrivate::StatusFlag>)mask.i);
  if (local_35 == false) {
    QDateTime::Data::detach((Data *)CONCAT44(iVar6,mask.i));
    in_stack_ffffffffffffffbc.i =
         (Int)operator~((enum_type)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    QVar3 = QFlags<QDateTimePrivate::StatusFlag>::operator&
                      ((QFlags<QDateTimePrivate::StatusFlag> *)&in_stack_ffffffffffffffa0->data,
                       (QFlags<QDateTimePrivate::StatusFlag>)in_stack_ffffffffffffffa8.i);
    pQVar5 = QDateTime::Data::operator->(in_RDI);
    (pQVar5->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i =
         (Int)QVar3.super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
              super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    pQVar5 = QDateTime::Data::operator->(in_RDI);
    pQVar5->m_offsetFromUtc = iVar6;
  }
  else {
    IVar2 = QFlags<QDateTimePrivate::StatusFlag>::toInt
                      ((QFlags<QDateTimePrivate::StatusFlag> *)&local_c);
    *(ulong *)in_RDI = *(ulong *)in_RDI & 0xffffffffffffff00 | (ulong)IVar2 & 0xff;
  }
  bVar1 = QTimeZone::isUtcOrFixedOffset(spec_00);
  if (bVar1) {
    refreshSimpleDateTime(in_stack_ffffffffffffffa0);
  }
  else {
    TVar4 = toTransitionOptions(in_ESI);
    refreshZonedDateTime
              ((QDateTimeData *)
               CONCAT44(in_stack_ffffffffffffffbc.i,
                        TVar4.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                        super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i),zone_00,
               (TransitionOptions)in_EDX.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void reviseTimeZone(QDateTimeData &d, const QTimeZone &zone,
                           QDateTime::TransitionResolution resolve)
{
    Qt::TimeSpec spec = zone.timeSpec();
    auto status = mergeSpec(getStatus(d), spec);
    bool reuse = d.isShort();
    int offset = 0;

    switch (spec) {
    case Qt::UTC:
        Q_ASSERT(zone.fixedSecondsAheadOfUtc() == 0);
        break;
    case Qt::OffsetFromUTC:
        reuse = false;
        offset = zone.fixedSecondsAheadOfUtc();
        Q_ASSERT(offset);
        break;
    case Qt::TimeZone:
        reuse = false;
        break;
    case Qt::LocalTime:
        break;
    }

    status &= ~(QDateTimePrivate::ValidDateTime | QDateTimePrivate::DaylightMask);
    if (reuse) {
        d.data.status = status.toInt();
    } else {
        d.detach();
        d->m_status = status & ~QDateTimePrivate::ShortData;
        d->m_offsetFromUtc = offset;
#if QT_CONFIG(timezone)
        if (spec == Qt::TimeZone)
            d->m_timeZone = zone;
#endif // timezone
    }

    if (QTimeZone::isUtcOrFixedOffset(spec))
        refreshSimpleDateTime(d);
    else
        refreshZonedDateTime(d, zone, toTransitionOptions(resolve));
}